

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O1

size_t __thiscall
cappuccino::tlru_cache<std::__cxx11::string,unsigned_long,(cappuccino::thread_safe)0>::
insert_range<std::vector<std::tuple<std::chrono::duration<long,std::ratio<1l,1000l>>,std::__cxx11::string,unsigned_long>,std::allocator<std::tuple<std::chrono::duration<long,std::ratio<1l,1000l>>,std::__cxx11::string,unsigned_long>>>>
          (tlru_cache<std::__cxx11::string,unsigned_long,(cappuccino::thread_safe)0> *this,
          vector<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *key_value_range,allow a)

{
  pointer ptVar1;
  bool bVar2;
  time_point now;
  size_t sVar3;
  pointer value;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  value = (key_value_range->
          super__Vector_base<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (key_value_range->
           super__Vector_base<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::tuple<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (value == ptVar1) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      bVar2 = tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)0>
              ::do_insert_update((tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)0>
                                  *)this,&(value->
                                          super__Tuple_impl<0UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                                          ).
                                          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                                          .
                                          super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                          ._M_head_impl,(unsigned_long *)value,now,
                                 (time_point)
                                 ((value->
                                  super__Tuple_impl<0UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                                  ).
                                  super__Head_base<0UL,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_false>
                                  ._M_head_impl.__r * 1000000 + (long)now.__d.__r),a);
      sVar3 = sVar3 + bVar2;
      value = value + 1;
    } while (value != ptVar1);
  }
  return sVar3;
}

Assistant:

auto insert_range(range_type&& key_value_range, allow a = allow::insert_or_update) -> size_t
    {
        auto   now = std::chrono::steady_clock::now();
        size_t inserted{0};

        {
            std::lock_guard guard{m_lock};
            for (auto& [ttl, key, value] : key_value_range)
            {
                auto expired_time = now + ttl;
                if (do_insert_update(key, std::move(value), now, expired_time, a))
                {
                    ++inserted;
                }
            }
        }

        return inserted;
    }